

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<float,2ul>
          (AsciiParser *this,char sep,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *result)

{
  pointer paVar1;
  StreamReader *pSVar2;
  bool bVar3;
  ulong uVar4;
  allocator *paVar5;
  char *pcVar6;
  allocator local_59;
  array<float,_2UL> value;
  array<float,_2UL> value_1;
  
  paVar1 = (result->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>)
      ._M_impl.super__Vector_impl_data._M_finish != paVar1) {
    (result->super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar1;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    bVar3 = ParseBasicTypeTuple<float,2ul>(this,&value);
    if (bVar3) {
      ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::push_back
                (result,&value);
      while (bVar3 = Eof(this), !bVar3) {
        bVar3 = SkipWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,(char *)&value);
        if (!bVar3) {
          return false;
        }
        if (value._M_elems[0]._0_1_ != sep) {
          pSVar2 = this->_sr;
          if ((0 < (long)pSVar2->idx_) && (uVar4 = pSVar2->idx_ - 1, uVar4 <= pSVar2->length_)) {
            pSVar2->idx_ = uVar4;
          }
          break;
        }
        bVar3 = SkipWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = ParseBasicTypeTuple<float,2ul>(this,&value_1);
        if (!bVar3) break;
        ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::push_back
                  (result,&value_1);
      }
      if ((result->
          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar6 = "Empty array.\n";
      paVar5 = (allocator *)&value;
    }
    else {
      pcVar6 = "Not starting with the tuple value of requested type.\n";
      paVar5 = &local_59;
    }
    ::std::__cxx11::string::string((string *)&value_1,pcVar6,paVar5);
    PushError(this,(string *)&value_1);
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(const char sep,
                                  std::vector<std::array<T, N>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}